

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Vta(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int c;
  Abs_Par_t *pPars;
  Abs_Par_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._128_8_ = argv;
  Abs_ParSetDefaults((Abs_Par_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_002c7a47:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars._128_8_,"FSPCLDETRAtradvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"There is no AIG.\n");
        return 0;
      }
      iVar1 = Gia_ManRegNum(pAbc->pGia);
      if (iVar1 == 0) {
        Abc_Print(-1,"The network is combinational.\n");
        return 0;
      }
      iVar1 = Gia_ManPoNum(pAbc->pGia);
      if (1 < iVar1) {
        Abc_Print(1,"The network is more than one PO (run \"orpos\").\n");
        return 0;
      }
      if ((int)(uint)pPars < 0) {
        Abc_Print(1,"The number of starting frames should be a positive integer.\n");
        return 0;
      }
      if (((uint)pPars != 0) && ((int)(uint)pPars < (int)pPars._4_4_)) {
        Abc_Print(1,"The starting frame is larger than the max number of frames.\n");
        return 0;
      }
      iVar1 = Gia_VtaPerform(pAbc->pGia,(Abs_Par_t *)&pPars);
      pAbc->Status = iVar1;
      pAbc->nFrames = Pars.fVerbose;
      Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
      return 0;
    }
    switch(iVar1) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by a file name.\n");
        goto LAB_002c80d7;
      }
      Pars._96_8_ = *(undefined8 *)(Pars._128_8_ + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002c7a47;
    default:
      goto LAB_002c80d7;
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002c80d7;
      }
      Pars.nFramesStart = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nFramesStart;
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_002c80d7;
      }
      Pars.nLearnedMax = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nLearnedMax;
      break;
    case 0x45:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-E\" should be followed by an integer.\n");
        goto LAB_002c80d7;
      }
      Pars.nLearnedStart = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nLearnedStart;
      break;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002c80d7;
      }
      pPars._0_4_ = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      uVar2 = (uint)pPars;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_002c80d7;
      }
      Pars.nConfLimit = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nConfLimit;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_002c80d7;
      }
      Pars.nFramesMax = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nFramesMax;
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_002c80d7;
      }
      Pars.nLearnedPerce = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nLearnedPerce;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_002c80d7;
      }
      pPars._4_4_ = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      uVar2 = pPars._4_4_;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002c80d7;
      }
      Pars.nLearnedDelta = atoi(*(char **)(Pars._128_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nLearnedDelta;
      break;
    case 0x61:
      Pars.fUseRollback = Pars.fUseRollback ^ 1;
      goto LAB_002c7a47;
    case 100:
      Pars.fSkipHash = Pars.fSkipHash ^ 1;
      goto LAB_002c7a47;
    case 0x68:
      goto LAB_002c80d7;
    case 0x72:
      Pars.nRatioMax = Pars.nRatioMax ^ 1;
      goto LAB_002c7a47;
    case 0x74:
      Pars.nRatioMin2 = Pars.nRatioMin2 ^ 1;
      goto LAB_002c7a47;
    case 0x76:
      Pars.pFileVabs._0_4_ = (uint)Pars.pFileVabs ^ 1;
      goto LAB_002c7a47;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_002c80d7:
      Abc_Print(-2,"usage: &vta [-FSPCLDETR num] [-A file] [-tradvh]\n");
      Abc_Print(-2,"\t          variable-time-frame gate-level proof- and cex-based abstraction\n");
      Abc_Print(-2,"\t-F num  : the max number of timeframes to unroll [default = %d]\n",
                (ulong)(uint)pPars);
      Abc_Print(-2,"\t-S num  : the starting time frame (0=unused) [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-P num  : the number of previous frames for UNSAT core [default = %d]\n",
                (ulong)(uint)Pars.nFramesMax);
      Abc_Print(-2,"\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n",
                (ulong)(uint)Pars.nFramesStart);
      Abc_Print(-2,
                "\t-L num  : the max number of learned clauses to keep (0=unused) [default = %d]\n",
                (ulong)(uint)Pars.nConfLimit);
      Abc_Print(-2,"\t-D num  : delta value for learned clause removal [default = %d]\n",
                (ulong)(uint)Pars.nLearnedMax);
      Abc_Print(-2,"\t-E num  : ratio percentage for learned clause removal [default = %d]\n",
                (ulong)(uint)Pars.nLearnedStart);
      Abc_Print(-2,"\t-T num  : an approximate timeout, in seconds [default = %d]\n",
                (ulong)(uint)Pars.nLearnedDelta);
      Abc_Print(-2,
                "\t-R num  : minimum percentage of abstracted objects (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)Pars.nLearnedPerce);
      Abc_Print(-2,"\t-A file : file name for dumping abstrated model [default = \"vabs.aig\"]\n");
      pcVar3 = "no";
      if (Pars.nRatioMin2 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-t      : toggle using terminal variables [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.nRatioMax != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r      : toggle using rollback after the starting frames [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (Pars.fUseRollback != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-a      : toggle refinement by adding one layers of gates [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (Pars.fSkipHash != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d      : toggle dumping abstracted model into a file [default = %s]\n",pcVar3
               );
      pcVar3 = "no";
      if ((uint)Pars.pFileVabs != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Vta( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abs_Par_t Pars, * pPars = &Pars;
    int c;
    Abs_ParSetDefaults( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FSPCLDETRAtradvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesStart < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesPast = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesPast < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedStart < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedDelta < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedPerce < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMin < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pFileVabs = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 't':
            pPars->fUseTermVars ^= 1;
            break;
        case 'r':
            pPars->fUseRollback ^= 1;
            break;
        case 'a':
            pPars->fAddLayer ^= 1;
            break;
        case 'd':
            pPars->fDumpVabs ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( Gia_ManPoNum(pAbc->pGia) > 1 )
    {
        Abc_Print( 1, "The network is more than one PO (run \"orpos\").\n" );
        return 0;
    }
    if ( pPars->nFramesMax < 0 )
    {
        Abc_Print( 1, "The number of starting frames should be a positive integer.\n" );
        return 0;
    }
    if ( pPars->nFramesMax && pPars->nFramesStart > pPars->nFramesMax )
    {
        Abc_Print( 1, "The starting frame is larger than the max number of frames.\n" );
        return 0;
    }
    pAbc->Status  = Gia_VtaPerform( pAbc->pGia, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &vta [-FSPCLDETR num] [-A file] [-tradvh]\n" );
    Abc_Print( -2, "\t          variable-time-frame gate-level proof- and cex-based abstraction\n" );
    Abc_Print( -2, "\t-F num  : the max number of timeframes to unroll [default = %d]\n", pPars->nFramesMax );
    Abc_Print( -2, "\t-S num  : the starting time frame (0=unused) [default = %d]\n", pPars->nFramesStart );
    Abc_Print( -2, "\t-P num  : the number of previous frames for UNSAT core [default = %d]\n", pPars->nFramesPast );
    Abc_Print( -2, "\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n", pPars->nConfLimit );
    Abc_Print( -2, "\t-L num  : the max number of learned clauses to keep (0=unused) [default = %d]\n", pPars->nLearnedStart );
    Abc_Print( -2, "\t-D num  : delta value for learned clause removal [default = %d]\n", pPars->nLearnedDelta );
    Abc_Print( -2, "\t-E num  : ratio percentage for learned clause removal [default = %d]\n", pPars->nLearnedPerce );
    Abc_Print( -2, "\t-T num  : an approximate timeout, in seconds [default = %d]\n", pPars->nTimeOut );
    Abc_Print( -2, "\t-R num  : minimum percentage of abstracted objects (0<=num<=100) [default = %d]\n", pPars->nRatioMin );
    Abc_Print( -2, "\t-A file : file name for dumping abstrated model [default = \"vabs.aig\"]\n" );
    Abc_Print( -2, "\t-t      : toggle using terminal variables [default = %s]\n", pPars->fUseTermVars? "yes": "no" );
    Abc_Print( -2, "\t-r      : toggle using rollback after the starting frames [default = %s]\n", pPars->fUseRollback? "yes": "no" );
    Abc_Print( -2, "\t-a      : toggle refinement by adding one layers of gates [default = %s]\n", pPars->fAddLayer? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggle dumping abstracted model into a file [default = %s]\n", pPars->fDumpVabs? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}